

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int make_directory(char *dir)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  char local_1038 [8];
  char dir_buf [4096];
  int rval;
  int maked;
  char *dp;
  char *cp;
  char *dir_local;
  
  bVar4 = false;
  _rval = local_1038;
  local_1038[0] = '/';
  dp = dir + 1;
  do {
    _rval = _rval + 1;
    if ((*dp == '\0') || (*dp == '/')) {
      *_rval = '\0';
      if (bVar4) {
        alarm(TIMEOUT_TIME);
        do {
          piVar2 = __errno_location();
          *piVar2 = 0;
          iVar1 = mkdir(local_1038,0x1ff);
          bVar3 = false;
          if (iVar1 == -1) {
            piVar2 = __errno_location();
            bVar3 = *piVar2 == 4;
          }
        } while (bVar3);
        alarm(0);
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          *Lisp_errno = *piVar2;
          return 0;
        }
        if (*dp == '\0') {
          strcpy(dir,local_1038);
          return 1;
        }
        *_rval = '/';
      }
      else {
        iVar1 = true_name(local_1038);
        if (iVar1 == -1) {
          if (*dp == '\0') {
            strcpy(dir,local_1038);
            return 1;
          }
          for (_rval = local_1038; *_rval != '\0'; _rval = _rval + 1) {
          }
          *_rval = '/';
        }
        else {
          if (iVar1 == 1) {
            return 0;
          }
          alarm(TIMEOUT_TIME);
          do {
            piVar2 = __errno_location();
            *piVar2 = 0;
            iVar1 = mkdir(local_1038,0x1ff);
            bVar4 = false;
            if (iVar1 == -1) {
              piVar2 = __errno_location();
              bVar4 = *piVar2 == 4;
            }
          } while (bVar4);
          alarm(0);
          if (iVar1 == -1) {
            piVar2 = __errno_location();
            *Lisp_errno = *piVar2;
            return 0;
          }
          if (*dp == '\0') {
            return 1;
          }
          *_rval = '/';
          bVar4 = true;
        }
      }
    }
    else {
      *_rval = *dp;
    }
    dp = dp + 1;
  } while( true );
}

Assistant:

static int make_directory(char *dir)
{
  char *cp, *dp;
  int maked, rval;
  char dir_buf[MAXPATHLEN];

  maked = 0;

  dp = dir_buf;
  cp = dir;

#ifdef DOS
  if (DRIVESEP == *(cp + 1)) {
    *dp++ - *cp++; /* copy the drive letter and colon */
    *dp++ = *cp++;
  }
#endif /* DOS */

  *dp++ = DIRSEP; /* For a root directory. */
  cp++;           /* Skip a root directory in dir. */

  for (;;) {
    switch (*cp) {
#ifdef DOS
      case DIRSEP:
#endif
      case '/':
      case '\0':
        *dp = '\0';
        /*
         * Now, dir_buf contains the absolute path to the next
         * subdirectory or file.  If one of the parent directories
         * are created, we have to create a new subdirectory
         * anyway.  If all of the parent directories are existing
         * directories, we have to check this subdirectory is an
         * existing or not.
         */
        if (maked) {
#ifdef DOS
          TIMEOUT(rval = mkdir(dir_buf));
#else
          TIMEOUT(rval = mkdir(dir_buf, 0777));
#endif /* DOS */
          if (rval == -1) {
            *Lisp_errno = errno;
            return (0);
          }
          if (*cp == '\0') {
            strcpy(dir, dir_buf);
            return (1);
          }
          *dp++ = DIRSEP;
          cp++;
        } else {
          switch (true_name(dir_buf)) {
            case -1: /* Directory */
              if (*cp == '\0') {
                /* Every subdirectories are examined. */
                strcpy(dir, dir_buf);
                return (1);
              } else {
                dp = dir_buf;
                while (*dp) dp++;
                *dp++ = DIRSEP;
                cp++;
              }
              break;

            case 1: /* Regular File */
              /*
               * UNIX does not allow to make a directory
               * and a file in the same name on a directory.
               */
              return (0);

            default:
/*
 * Should handle other cases. (special file).
 */
#ifdef DOS
              TIMEOUT(rval = mkdir(dir_buf));
#else
              TIMEOUT(rval = mkdir(dir_buf, 0777));
#endif /* DOS */
              if (rval == -1) {
                *Lisp_errno = errno;
                return (0);
              }
              if (*cp == '\0') return (1);
              *dp++ = DIRSEP;
              cp++;
              maked = 1;
              break;
          }
        }
        break;

      default: *dp++ = *cp++; break;
    }
  }
}